

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::DeleteNode
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparseNode *node,bool bResetLastUsed)

{
  BVSparseNode *pBVar1;
  Type pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000011;
  
  this->lastFoundIndex = (Type_conflict)0x0;
  pBVar1 = node->next;
  pJVar2 = this->alloc;
  node->next = pJVar2->bvFreeList;
  pJVar2->bvFreeList = node;
  if ((int)CONCAT71(in_register_00000011,bResetLastUsed) == 0) {
    if ((BVSparseNode *)this->lastUsedNodePrevNextField == node) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
                         ,0x209,"(this->lastUsedNodePrevNextField != &node->next)",
                         "this->lastUsedNodePrevNextField != &node->next");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  else {
    this->lastUsedNodePrevNextField = &this->head;
  }
  return pBVar1;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::DeleteNode(BVSparseNode *node, bool bResetLastUsed)
{
    this->lastFoundIndex = nullptr;
    BVSparseNode *next = node->next;
    QueueInFreeList(node);

    if (bResetLastUsed)
    {
        this->lastUsedNodePrevNextField = &this->head;
    }
    else
    {
        Assert(this->lastUsedNodePrevNextField != &node->next);
    }
    return next;
}